

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O0

ztast_value_t * ztast_value_nil(ztast_t *ast)

{
  long in_RDI;
  ztast_value_t *val;
  ztast_value_t *local_8;
  
  local_8 = (ztast_value_t *)(**(code **)(in_RDI + 8))(8,*(undefined8 *)(in_RDI + 0x18));
  if (local_8 == (ztast_value_t *)0x0) {
    local_8 = (ztast_value_t *)0x0;
  }
  else {
    local_8->type = ZTVAL_NIL;
  }
  return local_8;
}

Assistant:

ztast_value_t *ztast_value_nil(ztast_t *ast)
{
  ztast_value_t *val;

  assert(ast);

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_value_nil\n");
#endif

  val = ZTAST_MALLOC(sizeof(*val));
  if (val == NULL)
    return NULL;

  val->type = ZTVAL_NIL;

  return val;
}